

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffoptplt(fitsfile *fptr,char *tempname,int *status)

{
  int iVar1;
  int iVar2;
  fitsfile *tptr;
  int nkeys;
  int tstatus;
  int nadd;
  char card [81];
  
  tstatus = 0;
  iVar2 = *status;
  if ((tempname != (char *)0x0 && iVar2 < 1) && (*tempname != '\0')) {
    ffopen(&tptr,tempname,0,&tstatus);
    if (tstatus == 0) {
      ffmahd(tptr,1,(int *)0x0,status);
      while (iVar2 = 1, *status < 1) {
        ffghsp(tptr,&nkeys,&nadd,status);
        while( true ) {
          if (nkeys < iVar2) break;
          ffgrec(tptr,iVar2,card,status);
          if (card._0_8_ == 0x2020544e554f4350) {
            iVar1 = bcmp(card + 0x19,"    0",5);
            if (iVar1 != 0) {
              builtin_strncpy(card + 0x10,"             0",0xe);
              builtin_strncpy(card,"PCOUNT  =       ",0x10);
            }
          }
          ffprec(fptr,card,status);
          iVar2 = iVar2 + 1;
        }
        ffmrhd(tptr,1,(int *)0x0,status);
        ffcrhd(fptr,status);
      }
      if (*status == 0x6b) {
        *status = 0;
      }
      ffclos(tptr,status);
    }
    else {
      ffxmsg(2,card);
      fits_execute_template(fptr,tempname,status);
    }
    ffmahd(fptr,1,(int *)0x0,status);
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffoptplt(fitsfile *fptr,      /* O - FITS file pointer                   */
            const char *tempname, /* I - name of template file               */
            int *status)          /* IO - error status                       */
/*
  open template file and use it to create new file
*/
{
    fitsfile *tptr;
    int tstatus = 0, nkeys, nadd, ii;
    char card[FLEN_CARD];

    if (*status > 0)
        return(*status);

    if (tempname == NULL || *tempname == '\0')     /* no template file? */
        return(*status);

    /* try opening template */
    ffopen(&tptr, (char *) tempname, READONLY, &tstatus); 

    if (tstatus)  /* not a FITS file, so treat it as an ASCII template */
    {
        ffxmsg(2, card);  /* clear the  error message */
        fits_execute_template(fptr, (char *) tempname, status);

        ffmahd(fptr, 1, 0, status);   /* move back to the primary array */
        return(*status);
    }
    else  /* template is a valid FITS file */
    {
        ffmahd(tptr, 1, NULL, status); /* make sure we are at the beginning */
        while (*status <= 0)
        {
           ffghsp(tptr, &nkeys, &nadd, status); /* get no. of keywords */

           for (ii = 1; ii <= nkeys; ii++)   /* copy keywords */
           {
              ffgrec(tptr,  ii, card, status);

              /* must reset the PCOUNT keyword to zero in the new output file */
              if (strncmp(card, "PCOUNT  ",8) == 0) { /* the PCOUNT keyword? */
	         if (strncmp(card+25, "    0", 5)) {  /* non-zero value? */
		    strncpy(card, "PCOUNT  =                    0", 30);
		 }
	      }   
 
              ffprec(fptr, card, status);
           }

           ffmrhd(tptr, 1, 0, status); /* move to next HDU until error */
           ffcrhd(fptr, status);  /* create empty new HDU in output file */
        }

        if (*status == END_OF_FILE)
        {
           *status = 0;              /* expected error condition */
        }
        ffclos(tptr, status);       /* close the template file */
    }

    ffmahd(fptr, 1, 0, status);   /* move to the primary array */
    return(*status);
}